

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

char * __thiscall
google::protobuf::ServiceOptions::_InternalParse(ServiceOptions *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  Rep *pRVar4;
  uint uVar5;
  UninterpretedOption *msg;
  uint tag;
  uint32 uVar6;
  uint uVar7;
  char cVar8;
  pair<const_char_*,_unsigned_int> pVar9;
  pair<const_char_*,_unsigned_long> pVar10;
  pair<const_char_*,_bool> pVar11;
  
  uVar7 = 0;
  do {
    if (ptr < (ctx->super_EpsCopyInputStream).limit_end_) {
      pVar11._8_8_ = 0;
      pVar11.first = ptr;
    }
    else {
      pVar11._8_8_ = 1;
      pVar11.first = ptr;
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ !=
          (long)(ctx->super_EpsCopyInputStream).limit_) {
        pVar11 = internal::EpsCopyInputStream::DoneFallback
                           (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
      }
    }
    ptr = pVar11.first;
    if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
    goto LAB_002f3395;
    bVar1 = *ptr;
    pVar9.second._0_1_ = bVar1;
    pVar9.first = (char *)((byte *)ptr + 1);
    pVar9._9_7_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = ((byte *)ptr)[1];
      uVar6 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar9 = internal::ReadTagFallback(ptr,uVar6);
      }
      else {
        pVar9.second = uVar6;
        pVar9.first = (char *)((byte *)ptr + 2);
        pVar9._12_4_ = 0;
      }
    }
    ptr = pVar9.first;
    cVar8 = '\x04';
    if ((byte *)ptr != (byte *)0x0) {
      tag = pVar9.second;
      uVar5 = (uint)(pVar9._8_8_ >> 3) & 0x1fffffff;
      if (uVar5 == 999) {
        if ((char)pVar9.second != ':') goto LAB_002f32b3;
        ptr = (char *)((byte *)ptr + -2);
        do {
          pRVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar4 == (Rep *)0x0) {
LAB_002f3239:
            internal::RepeatedPtrFieldBase::Reserve
                      (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,
                       (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_002f3246:
            pRVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
            pRVar4->allocated_size = pRVar4->allocated_size + 1;
            msg = Arena::CreateMaybeMessage<google::protobuf::UninterpretedOption>
                            ((this->uninterpreted_option_).super_RepeatedPtrFieldBase.arena_);
            pRVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
            iVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
            (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            pRVar4->elements[iVar3] = msg;
          }
          else {
            iVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
            if (pRVar4->allocated_size <= iVar3) {
              if (pRVar4->allocated_size ==
                  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_002f3239;
              goto LAB_002f3246;
            }
            (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            msg = (UninterpretedOption *)pRVar4->elements[iVar3];
          }
          ptr = internal::ParseContext::ParseMessage<google::protobuf::UninterpretedOption>
                          (ctx,msg,(char *)((byte *)ptr + 2));
          if ((byte *)ptr == (byte *)0x0) goto LAB_002f3354;
        } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*(short *)ptr == 0x3eba));
        cVar8 = '\x02';
      }
      else if ((uVar5 == 0x21) && ((char)pVar9.second == '\b')) {
        bVar1 = *ptr;
        pVar10.second = (long)(char)bVar1;
        pVar10.first = (char *)((byte *)ptr + 1);
        if ((long)(char)bVar1 < 0) {
          bVar2 = ((byte *)ptr)[1];
          uVar6 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
          if ((char)bVar2 < '\0') {
            pVar10 = internal::VarintParseSlow64(ptr,uVar6);
          }
          else {
            pVar10.second._0_4_ = uVar6;
            pVar10.first = (char *)((byte *)ptr + 2);
            pVar10.second._4_4_ = 0;
          }
        }
        ptr = pVar10.first;
        this->deprecated_ = pVar10.second != 0;
        cVar8 = ((byte *)ptr == (byte *)0x0) * '\x02' + '\x02';
        uVar7 = 1;
      }
      else {
LAB_002f32b3:
        if (tag == 0 || (tag & 7) == 4) {
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
          cVar8 = '\t';
        }
        else {
          if (tag < 8000) {
            ptr = internal::UnknownFieldParse(tag,&this->_internal_metadata_,ptr,ctx);
          }
          else {
            ptr = internal::ExtensionSet::ParseField
                            (&this->_extensions_,pVar9._8_8_ & 0xffffffff,ptr,
                             (Message *)_ServiceOptions_default_instance_,&this->_internal_metadata_
                             ,ctx);
          }
          cVar8 = ((byte *)ptr == (byte *)0x0) * '\x02' + '\x02';
        }
      }
    }
LAB_002f3354:
  } while (cVar8 == '\x02');
  if (cVar8 == '\x04') {
    ptr = (char *)0x0;
  }
LAB_002f3395:
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar7;
  return (char *)(byte *)ptr;
}

Assistant:

const char* ServiceOptions::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional bool deprecated = 33 [default = false];
      case 33:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 8)) {
          _Internal::set_has_deprecated(&has_bits);
          deprecated_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr -= 2;
          do {
            ptr += 2;
            ptr = ctx->ParseMessage(_internal_add_uninterpreted_option(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<7994>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
      if ((8000u <= tag)) {
        ptr = _extensions_.ParseField(tag, ptr,
            internal_default_instance(), &_internal_metadata_, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}